

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnTryExpr(BinaryReaderIR *this,Type sig_type)

{
  Result RVar1;
  Result RVar2;
  TryExpr *this_00;
  _Head_base<0UL,_wabt::Expr_*,_false> local_50;
  Location local_48;
  
  this_00 = (TryExpr *)operator_new(0x178);
  local_48.field_1.field_0.line = 0;
  local_48.field_1._4_8_ = 0;
  local_48.filename._M_len = 0;
  local_48.filename._M_str._0_4_ = 0;
  local_48.filename._M_str._4_4_ = 0;
  TryExpr::TryExpr(this_00,&local_48);
  SetBlockDeclaration(this,&(this_00->block).decl,sig_type);
  local_50._M_head_impl = (Expr *)this_00;
  RVar1 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_50);
  if ((TryExpr *)local_50._M_head_impl != (TryExpr *)0x0) {
    (*(local_50._M_head_impl)->_vptr_Expr[1])();
  }
  RVar2.enum_ = Error;
  if (RVar1.enum_ != Error) {
    (this->module_->features_used).exceptions = true;
    RVar2 = PushLabel(this,Try,&(this_00->block).exprs,(Expr *)this_00);
  }
  return (Result)RVar2.enum_;
}

Assistant:

Result BinaryReaderIR::OnTryExpr(Type sig_type) {
  auto expr_ptr = std::make_unique<TryExpr>();
  // Save expr so it can be used below, after expr_ptr has been moved.
  TryExpr* expr = expr_ptr.get();
  ExprList* expr_list = &expr->block.exprs;
  SetBlockDeclaration(&expr->block.decl, sig_type);
  CHECK_RESULT(AppendExpr(std::move(expr_ptr)));
  module_->features_used.exceptions = true;
  return PushLabel(LabelType::Try, expr_list, expr);
}